

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug-test.c++
# Opt level: O3

void __thiscall kj::_::anon_unknown_0::TestCase347::run(TestCase347 *this)

{
  string *psVar1;
  ExceptionCallback *pEVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  char *pcVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  _Alloc_hider _Var10;
  bool bVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  bool recovered;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  string text;
  MockExceptionCallback mockCallback;
  int i;
  string local_198;
  char *str;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  i = 0x7b;
  str = "foo";
  text._M_dataplus._M_p = (pointer)&text.field_2;
  text._M_string_length = 0;
  text.field_2._M_local_buf[0] = '\0';
  ExceptionCallback::ExceptionCallback(&mockCallback.super_ExceptionCallback);
  mockCallback.super_ExceptionCallback._vptr_ExceptionCallback =
       (_func_int **)&PTR__MockExceptionCallback_002256d0;
  mockCallback.text._M_dataplus._M_p = (pointer)&mockCallback.text.field_2;
  mockCallback.text._M_string_length = 0;
  mockCallback.text.field_2._M_allocated_capacity =
       mockCallback.text.field_2._M_allocated_capacity & 0xffffffffffffff00;
  mockCallback.outputPipe = -1;
  piVar5 = __errno_location();
  *piVar5 = 0;
  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&text,&mockCallback.text);
  MockExceptionCallback::~MockExceptionCallback(&mockCallback);
  iVar3 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&text,"");
  mockCallback.super_ExceptionCallback._vptr_ExceptionCallback = (_func_int **)0x1e8606;
  mockCallback.text._M_dataplus._M_p = " == ";
  mockCallback.text._M_string_length = 5;
  mockCallback.text.field_2._M_local_buf[0] = iVar3 == 0;
  mockCallback.super_ExceptionCallback.next = (ExceptionCallback *)&text;
  if ((iVar3 != 0) && (Debug::minSeverity < 3)) {
    Debug::
    log<char_const(&)[32],kj::_::DebugComparison<char_const(&)[1],std::__cxx11::string&>&,char_const(&)[1],std::__cxx11::string&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++"
               ,0x164,ERROR,
               "\"failed: expected \" \"(\\\"\\\") == (text)\", _kjCondition, \"\", text",
               (char (*) [32])"failed: expected (\"\") == (text)",
               (DebugComparison<const_char_(&)[1],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&mockCallback,(char (*) [1])0x1e8606,&text);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)text._M_dataplus._M_p != &text.field_2) {
    operator_delete(text._M_dataplus._M_p,
                    CONCAT71(text.field_2._M_allocated_capacity._1_7_,text.field_2._M_local_buf[0])
                    + 1);
  }
  text._M_dataplus._M_p = (pointer)&text.field_2;
  text._M_string_length = 0;
  text.field_2._M_local_buf[0] = '\0';
  ExceptionCallback::ExceptionCallback(&mockCallback.super_ExceptionCallback);
  mockCallback.super_ExceptionCallback._vptr_ExceptionCallback =
       (_func_int **)&PTR__MockExceptionCallback_002256d0;
  mockCallback.text._M_dataplus._M_p = (pointer)&mockCallback.text.field_2;
  mockCallback.text._M_string_length = 0;
  mockCallback.text.field_2._M_allocated_capacity =
       mockCallback.text.field_2._M_allocated_capacity & 0xffffffffffffff00;
  mockCallback.outputPipe = -1;
  do {
    *piVar5 = 9;
    iVar3 = Debug::getOsErrorNumber(false);
  } while (iVar3 == -1);
  if (iVar3 != 0) {
    Debug::Fault::Fault<int,int&,char_const(&)[4],char_const*&>
              ((Fault *)&local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++"
               ,0x167,iVar3,"mockSyscall(-1, EBADF)","i, \"bar\", str",&i,(char (*) [4])0x1cedd5,
               &str);
    Debug::Fault::fatal((Fault *)&local_240);
  }
  if (Debug::minSeverity < 3) {
    Debug::log<char_const(&)[19]>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++"
               ,0x167,ERROR,"\"expected exception\"",(char (*) [19])"expected exception");
  }
  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&text,&mockCallback.text);
  MockExceptionCallback::~MockExceptionCallback(&mockCallback);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++"
             ,"");
  fileLine(&local_198,&local_50,0x167);
  pbVar6 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           replace(&local_198,0,0,"fatal exception: ",0x11);
  local_220._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
  paVar8 = &pbVar6->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p == paVar8) {
    local_220.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_220.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
    local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
  }
  else {
    local_220.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
  }
  local_220._M_string_length = pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
  pbVar6->_M_string_length = 0;
  (pbVar6->field_2)._M_local_buf[0] = '\0';
  pbVar6 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_220,": failed: mockSyscall(-1, EBADF): ");
  local_2a8._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
  paVar8 = &pbVar6->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p == paVar8) {
    local_2a8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_2a8.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
    local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
  }
  else {
    local_2a8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
  }
  local_2a8._M_string_length = pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
  pbVar6->_M_string_length = 0;
  (pbVar6->field_2)._M_local_buf[0] = '\0';
  pcVar7 = strerror(9);
  pbVar6 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_2a8,pcVar7);
  local_288._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
  paVar8 = &pbVar6->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p == paVar8) {
    local_288.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_288.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
    local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
  }
  else {
    local_288.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
  }
  local_288._M_string_length = pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
  pbVar6->_M_string_length = 0;
  (pbVar6->field_2)._M_local_buf[0] = '\0';
  pbVar6 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_288,"; i = 123; bar; str = foo\n");
  paVar8 = &local_268.field_2;
  local_268._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
  paVar9 = &pbVar6->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p == paVar9) {
    local_268.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_268.field_2._8_8_ = *(size_type *)((long)&pbVar6->field_2 + 8);
    local_268._M_dataplus._M_p = (pointer)paVar8;
  }
  else {
    local_268.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
  }
  pEVar2 = (ExceptionCallback *)pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar9;
  pbVar6->_M_string_length = 0;
  (pbVar6->field_2)._M_local_buf[0] = '\0';
  paVar9 = &local_240.field_2;
  _Var10._M_p = local_268._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p == paVar8) {
    local_240.field_2._8_8_ = local_268.field_2._8_8_;
    _Var10._M_p = (pointer)paVar9;
  }
  local_240.field_2._M_allocated_capacity = local_268.field_2._M_allocated_capacity;
  local_268._M_string_length = 0;
  local_268.field_2._M_allocated_capacity =
       local_268.field_2._M_allocated_capacity & 0xffffffffffffff00;
  if (pEVar2 == (ExceptionCallback *)text._M_string_length) {
    bVar11 = true;
    local_268._M_dataplus._M_p = (pointer)paVar8;
    if (pEVar2 != (ExceptionCallback *)0x0) {
      local_240._M_dataplus._M_p = _Var10._M_p;
      local_240._M_string_length = (size_type)pEVar2;
      iVar3 = bcmp(_Var10._M_p,text._M_dataplus._M_p,(size_t)pEVar2);
      bVar11 = iVar3 == 0;
    }
  }
  else {
    bVar11 = false;
    local_268._M_dataplus._M_p = (pointer)paVar8;
  }
  mockCallback.super_ExceptionCallback._vptr_ExceptionCallback = (_func_int **)_Var10._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var10._M_p == paVar9) {
    mockCallback.text._M_string_length = local_240.field_2._8_8_;
    mockCallback.super_ExceptionCallback._vptr_ExceptionCallback = (_func_int **)&mockCallback.text;
  }
  mockCallback.text._M_dataplus._M_p = (pointer)local_240.field_2._M_allocated_capacity;
  local_240._M_string_length = 0;
  local_240.field_2._M_allocated_capacity =
       local_240.field_2._M_allocated_capacity & 0xffffffffffffff00;
  mockCallback.text.field_2._M_allocated_capacity = (size_type)&text;
  mockCallback.text.field_2._8_8_ = anon_var_dwarf_19d17;
  mockCallback.outputPipe = 5;
  mockCallback._52_4_ = 0;
  local_240._M_dataplus._M_p = (pointer)paVar9;
  mockCallback.super_ExceptionCallback.next = pEVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((!bVar11) && (Debug::minSeverity < 3)) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++"
               ,"");
    fileLine(&local_220,&local_70,0x167);
    pbVar6 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_220,0,0,"fatal exception: ",0x11);
    local_2a8._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
    paVar9 = &pbVar6->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p == paVar9) {
      local_2a8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
      local_2a8.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
      local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
    }
    else {
      local_2a8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    }
    local_2a8._M_string_length = pbVar6->_M_string_length;
    (pbVar6->_M_dataplus)._M_p = (pointer)paVar9;
    pbVar6->_M_string_length = 0;
    (pbVar6->field_2)._M_local_buf[0] = '\0';
    pbVar6 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             append(&local_2a8,": failed: mockSyscall(-1, EBADF): ");
    local_288._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
    paVar9 = &pbVar6->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p == paVar9) {
      local_288.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
      local_288.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
      local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
    }
    else {
      local_288.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    }
    local_288._M_string_length = pbVar6->_M_string_length;
    (pbVar6->_M_dataplus)._M_p = (pointer)paVar9;
    pbVar6->_M_string_length = 0;
    (pbVar6->field_2)._M_local_buf[0] = '\0';
    pcVar7 = strerror(9);
    pbVar6 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             append(&local_288,pcVar7);
    local_268._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
    paVar9 = &pbVar6->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p == paVar9) {
      local_268.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
      local_268.field_2._8_8_ = *(size_type *)((long)&pbVar6->field_2 + 8);
      local_268._M_dataplus._M_p = (pointer)paVar8;
    }
    else {
      local_268.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    }
    local_268._M_string_length = pbVar6->_M_string_length;
    (pbVar6->_M_dataplus)._M_p = (pointer)paVar9;
    pbVar6->_M_string_length = 0;
    (pbVar6->field_2)._M_local_buf[0] = '\0';
    pbVar6 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             append(&local_268,"; i = 123; bar; str = foo\n");
    local_240._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
    paVar9 = &pbVar6->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p == paVar9) {
      local_240.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
      local_240.field_2._8_8_ = *(size_type *)((long)&pbVar6->field_2 + 8);
      local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
    }
    else {
      local_240.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    }
    local_240._M_string_length = pbVar6->_M_string_length;
    (pbVar6->_M_dataplus)._M_p = (pointer)paVar9;
    pbVar6->_M_string_length = 0;
    (pbVar6->field_2)._M_local_buf[0] = '\0';
    Debug::
    log<char_const(&)[256],kj::_::DebugComparison<std::__cxx11::string,std::__cxx11::string&>&,std::__cxx11::string,std::__cxx11::string&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++"
               ,0x16c,ERROR,
               "\"failed: expected \" \"(( \\\"fatal exception: \\\" + fileLine(\\\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++\\\", line) + \\\": failed: mockSyscall(-1, EBADF): \\\" + strerror(9) + \\\"; i = 123; bar; str = foo\\\\n\\\" )) == (text)\", _kjCondition, ( \"fatal exception: \" + fileLine(\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++\", line) + \": failed: mockSyscall(-1, EBADF): \" + strerror(9) + \"; i = 123; bar; str = foo\\n\" ), text"
               ,(char (*) [256])
                "failed: expected (( \"fatal exception: \" + fileLine(\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++\", line) + \": failed: mockSyscall(-1, EBADF): \" + strerror(9) + \"; i = 123; bar; str = foo\\n\" )) == (text)"
               ,(DebugComparison<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                 *)&mockCallback,&local_240,&text);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != paVar8) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != &local_288.field_2) {
      operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
      operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  if ((string *)mockCallback.super_ExceptionCallback._vptr_ExceptionCallback != &mockCallback.text)
  {
    operator_delete(mockCallback.super_ExceptionCallback._vptr_ExceptionCallback,
                    (ulong)(mockCallback.text._M_dataplus._M_p + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)text._M_dataplus._M_p != &text.field_2) {
    operator_delete(text._M_dataplus._M_p,
                    CONCAT71(text.field_2._M_allocated_capacity._1_7_,text.field_2._M_local_buf[0])
                    + 1);
  }
  text._M_dataplus._M_p = (pointer)&text.field_2;
  text._M_string_length = 0;
  text.field_2._M_local_buf[0] = '\0';
  ExceptionCallback::ExceptionCallback(&mockCallback.super_ExceptionCallback);
  psVar1 = &mockCallback.text;
  mockCallback.super_ExceptionCallback._vptr_ExceptionCallback =
       (_func_int **)&PTR__MockExceptionCallback_002256d0;
  mockCallback.text._M_dataplus._M_p = (pointer)&mockCallback.text.field_2;
  mockCallback.text._M_string_length = 0;
  mockCallback.text.field_2._M_allocated_capacity =
       mockCallback.text.field_2._M_allocated_capacity & 0xffffffffffffff00;
  mockCallback.outputPipe = -1;
  do {
    *piVar5 = 0x68;
    iVar3 = Debug::getOsErrorNumber(false);
  } while (iVar3 == -1);
  if (iVar3 != 0) {
    Debug::Fault::Fault<int,int&,char_const(&)[4],char_const*&>
              ((Fault *)&local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++"
               ,0x16f,iVar3,"mockSyscall(-1, ECONNRESET)","i, \"bar\", str",&i,
               (char (*) [4])0x1cedd5,&str);
    Debug::Fault::fatal((Fault *)&local_240);
  }
  if (Debug::minSeverity < 3) {
    Debug::log<char_const(&)[19]>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++"
               ,0x16f,ERROR,"\"expected exception\"",(char (*) [19])"expected exception");
  }
  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&text,psVar1);
  MockExceptionCallback::~MockExceptionCallback(&mockCallback);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++"
             ,"");
  fileLine(&local_198,&local_90,0x16f);
  pbVar6 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           replace(&local_198,0,0,"fatal exception: ",0x11);
  local_220._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
  paVar8 = &pbVar6->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p == paVar8) {
    local_220.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_220.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
    local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
  }
  else {
    local_220.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
  }
  local_220._M_string_length = pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
  pbVar6->_M_string_length = 0;
  (pbVar6->field_2)._M_local_buf[0] = '\0';
  pbVar6 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_220,": disconnected: mockSyscall(-1, ECONNRESET): ");
  local_2a8._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
  paVar8 = &pbVar6->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p == paVar8) {
    local_2a8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_2a8.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
    local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
  }
  else {
    local_2a8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
  }
  local_2a8._M_string_length = pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
  pbVar6->_M_string_length = 0;
  (pbVar6->field_2)._M_local_buf[0] = '\0';
  pcVar7 = strerror(0x68);
  pbVar6 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_2a8,pcVar7);
  local_288._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
  paVar8 = &pbVar6->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p == paVar8) {
    local_288.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_288.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
    local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
  }
  else {
    local_288.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
  }
  local_288._M_string_length = pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
  pbVar6->_M_string_length = 0;
  (pbVar6->field_2)._M_local_buf[0] = '\0';
  pbVar6 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_288,"; i = 123; bar; str = foo\n");
  paVar8 = &local_268.field_2;
  local_268._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
  paVar9 = &pbVar6->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p == paVar9) {
    local_268.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_268.field_2._8_8_ = *(size_type *)((long)&pbVar6->field_2 + 8);
    local_268._M_dataplus._M_p = (pointer)paVar8;
  }
  else {
    local_268.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
  }
  pEVar2 = (ExceptionCallback *)pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar9;
  pbVar6->_M_string_length = 0;
  (pbVar6->field_2)._M_local_buf[0] = '\0';
  paVar9 = &local_240.field_2;
  _Var10._M_p = local_268._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p == paVar8) {
    local_240.field_2._8_8_ = local_268.field_2._8_8_;
    _Var10._M_p = (pointer)paVar9;
  }
  local_240.field_2._M_allocated_capacity = local_268.field_2._M_allocated_capacity;
  local_268._M_string_length = 0;
  local_268.field_2._M_allocated_capacity =
       local_268.field_2._M_allocated_capacity & 0xffffffffffffff00;
  if (pEVar2 == (ExceptionCallback *)text._M_string_length) {
    bVar11 = true;
    local_268._M_dataplus._M_p = (pointer)paVar8;
    if (pEVar2 != (ExceptionCallback *)0x0) {
      local_240._M_dataplus._M_p = _Var10._M_p;
      local_240._M_string_length = (size_type)pEVar2;
      iVar3 = bcmp(_Var10._M_p,text._M_dataplus._M_p,(size_t)pEVar2);
      bVar11 = iVar3 == 0;
    }
  }
  else {
    bVar11 = false;
    local_268._M_dataplus._M_p = (pointer)paVar8;
  }
  mockCallback.super_ExceptionCallback._vptr_ExceptionCallback = (_func_int **)_Var10._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var10._M_p == paVar9) {
    mockCallback.text._M_string_length = local_240.field_2._8_8_;
    mockCallback.super_ExceptionCallback._vptr_ExceptionCallback = (_func_int **)psVar1;
  }
  mockCallback.text._M_dataplus._M_p = (pointer)local_240.field_2._M_allocated_capacity;
  local_240._M_string_length = 0;
  local_240.field_2._M_allocated_capacity =
       local_240.field_2._M_allocated_capacity & 0xffffffffffffff00;
  mockCallback.text.field_2._M_allocated_capacity = (size_type)&text;
  mockCallback.text.field_2._8_8_ = anon_var_dwarf_19d17;
  mockCallback.outputPipe = 5;
  mockCallback._52_4_ = 0;
  local_240._M_dataplus._M_p = (pointer)paVar9;
  mockCallback.super_ExceptionCallback.next = pEVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((!bVar11) && (Debug::minSeverity < 3)) {
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++"
               ,"");
    fileLine(&local_220,&local_b0,0x16f);
    pbVar6 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_220,0,0,"fatal exception: ",0x11);
    local_2a8._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
    paVar8 = &pbVar6->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p == paVar8) {
      local_2a8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
      local_2a8.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
      local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
    }
    else {
      local_2a8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    }
    local_2a8._M_string_length = pbVar6->_M_string_length;
    (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
    pbVar6->_M_string_length = 0;
    (pbVar6->field_2)._M_local_buf[0] = '\0';
    pbVar6 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             append(&local_2a8,": disconnected: mockSyscall(-1, ECONNRESET): ");
    local_288._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
    paVar8 = &pbVar6->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p == paVar8) {
      local_288.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
      local_288.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
      local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
    }
    else {
      local_288.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    }
    local_288._M_string_length = pbVar6->_M_string_length;
    (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
    pbVar6->_M_string_length = 0;
    (pbVar6->field_2)._M_local_buf[0] = '\0';
    pcVar7 = strerror(0x68);
    pbVar6 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             append(&local_288,pcVar7);
    local_268._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
    paVar8 = &pbVar6->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p == paVar8) {
      local_268.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
      local_268.field_2._8_8_ = *(size_type *)((long)&pbVar6->field_2 + 8);
      local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
    }
    else {
      local_268.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    }
    local_268._M_string_length = pbVar6->_M_string_length;
    (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
    pbVar6->_M_string_length = 0;
    (pbVar6->field_2)._M_local_buf[0] = '\0';
    pbVar6 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             append(&local_268,"; i = 123; bar; str = foo\n");
    local_240._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
    paVar8 = &pbVar6->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p == paVar8) {
      local_240.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
      local_240.field_2._8_8_ = *(size_type *)((long)&pbVar6->field_2 + 8);
      local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
    }
    else {
      local_240.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    }
    local_240._M_string_length = pbVar6->_M_string_length;
    (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
    pbVar6->_M_string_length = 0;
    (pbVar6->field_2)._M_local_buf[0] = '\0';
    Debug::
    log<char_const(&)[269],kj::_::DebugComparison<std::__cxx11::string,std::__cxx11::string&>&,std::__cxx11::string,std::__cxx11::string&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++"
               ,0x174,ERROR,
               "\"failed: expected \" \"(( \\\"fatal exception: \\\" + fileLine(\\\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++\\\", line) + \\\": disconnected: mockSyscall(-1, ECONNRESET): \\\" + strerror(104) + \\\"; i = 123; bar; str = foo\\\\n\\\" )) == (text)\", _kjCondition, ( \"fatal exception: \" + fileLine(\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++\", line) + \": disconnected: mockSyscall(-1, ECONNRESET): \" + strerror(104) + \"; i = 123; bar; str = foo\\n\" ), text"
               ,(char (*) [269])
                "failed: expected (( \"fatal exception: \" + fileLine(\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++\", line) + \": disconnected: mockSyscall(-1, ECONNRESET): \" + strerror(104) + \"; i = 123; bar; str = foo\\n\" )) == (text)"
               ,(DebugComparison<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                 *)&mockCallback,&local_240,&text);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != &local_288.field_2) {
      operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
      operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((string *)mockCallback.super_ExceptionCallback._vptr_ExceptionCallback != psVar1) {
    operator_delete(mockCallback.super_ExceptionCallback._vptr_ExceptionCallback,
                    (ulong)(mockCallback.text._M_dataplus._M_p + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)text._M_dataplus._M_p != &text.field_2) {
    operator_delete(text._M_dataplus._M_p,
                    CONCAT71(text.field_2._M_allocated_capacity._1_7_,text.field_2._M_local_buf[0])
                    + 1);
  }
  text._M_dataplus._M_p = (pointer)&text.field_2;
  text._M_string_length = 0;
  text.field_2._M_local_buf[0] = '\0';
  ExceptionCallback::ExceptionCallback(&mockCallback.super_ExceptionCallback);
  psVar1 = &mockCallback.text;
  mockCallback.super_ExceptionCallback._vptr_ExceptionCallback =
       (_func_int **)&PTR__MockExceptionCallback_002256d0;
  mockCallback.text._M_dataplus._M_p = (pointer)&mockCallback.text.field_2;
  mockCallback.text._M_string_length = 0;
  mockCallback.text.field_2._M_allocated_capacity =
       mockCallback.text.field_2._M_allocated_capacity & 0xffffffffffffff00;
  mockCallback.outputPipe = -1;
  do {
    *piVar5 = 0xc;
    iVar3 = Debug::getOsErrorNumber(false);
  } while (iVar3 == -1);
  if (iVar3 != 0) {
    Debug::Fault::Fault<int,int&,char_const(&)[4],char_const*&>
              ((Fault *)&local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++"
               ,0x177,iVar3,"mockSyscall(-1, ENOMEM)","i, \"bar\", str",&i,(char (*) [4])0x1cedd5,
               &str);
    Debug::Fault::fatal((Fault *)&local_240);
  }
  if (Debug::minSeverity < 3) {
    Debug::log<char_const(&)[19]>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++"
               ,0x177,ERROR,"\"expected exception\"",(char (*) [19])"expected exception");
  }
  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&text,psVar1);
  MockExceptionCallback::~MockExceptionCallback(&mockCallback);
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d0,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++"
             ,"");
  fileLine(&local_198,&local_d0,0x177);
  pbVar6 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           replace(&local_198,0,0,"fatal exception: ",0x11);
  local_220._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
  paVar8 = &pbVar6->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p == paVar8) {
    local_220.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_220.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
    local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
  }
  else {
    local_220.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
  }
  local_220._M_string_length = pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
  pbVar6->_M_string_length = 0;
  (pbVar6->field_2)._M_local_buf[0] = '\0';
  pbVar6 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_220,": overloaded: mockSyscall(-1, ENOMEM): ");
  local_2a8._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
  paVar8 = &pbVar6->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p == paVar8) {
    local_2a8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_2a8.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
    local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
  }
  else {
    local_2a8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
  }
  local_2a8._M_string_length = pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
  pbVar6->_M_string_length = 0;
  (pbVar6->field_2)._M_local_buf[0] = '\0';
  pcVar7 = strerror(0xc);
  pbVar6 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_2a8,pcVar7);
  local_288._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
  paVar8 = &pbVar6->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p == paVar8) {
    local_288.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_288.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
    local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
  }
  else {
    local_288.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
  }
  local_288._M_string_length = pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
  pbVar6->_M_string_length = 0;
  (pbVar6->field_2)._M_local_buf[0] = '\0';
  pbVar6 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_288,"; i = 123; bar; str = foo\n");
  paVar8 = &local_268.field_2;
  local_268._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
  paVar9 = &pbVar6->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p == paVar9) {
    local_268.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_268.field_2._8_8_ = *(size_type *)((long)&pbVar6->field_2 + 8);
    local_268._M_dataplus._M_p = (pointer)paVar8;
  }
  else {
    local_268.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
  }
  pEVar2 = (ExceptionCallback *)pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar9;
  pbVar6->_M_string_length = 0;
  (pbVar6->field_2)._M_local_buf[0] = '\0';
  paVar9 = &local_240.field_2;
  _Var10._M_p = local_268._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p == paVar8) {
    local_240.field_2._8_8_ = local_268.field_2._8_8_;
    _Var10._M_p = (pointer)paVar9;
  }
  local_240.field_2._M_allocated_capacity = local_268.field_2._M_allocated_capacity;
  local_268._M_string_length = 0;
  local_268.field_2._M_allocated_capacity =
       local_268.field_2._M_allocated_capacity & 0xffffffffffffff00;
  if (pEVar2 == (ExceptionCallback *)text._M_string_length) {
    bVar11 = true;
    local_268._M_dataplus._M_p = (pointer)paVar8;
    if (pEVar2 != (ExceptionCallback *)0x0) {
      local_240._M_dataplus._M_p = _Var10._M_p;
      local_240._M_string_length = (size_type)pEVar2;
      iVar3 = bcmp(_Var10._M_p,text._M_dataplus._M_p,(size_t)pEVar2);
      bVar11 = iVar3 == 0;
    }
  }
  else {
    bVar11 = false;
    local_268._M_dataplus._M_p = (pointer)paVar8;
  }
  mockCallback.super_ExceptionCallback._vptr_ExceptionCallback = (_func_int **)_Var10._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var10._M_p == paVar9) {
    mockCallback.text._M_string_length = local_240.field_2._8_8_;
    mockCallback.super_ExceptionCallback._vptr_ExceptionCallback = (_func_int **)psVar1;
  }
  mockCallback.text._M_dataplus._M_p = (pointer)local_240.field_2._M_allocated_capacity;
  local_240._M_string_length = 0;
  local_240.field_2._M_allocated_capacity =
       local_240.field_2._M_allocated_capacity & 0xffffffffffffff00;
  mockCallback.text.field_2._M_allocated_capacity = (size_type)&text;
  mockCallback.text.field_2._8_8_ = anon_var_dwarf_19d17;
  mockCallback.outputPipe = 5;
  mockCallback._52_4_ = 0;
  local_240._M_dataplus._M_p = (pointer)paVar9;
  mockCallback.super_ExceptionCallback.next = pEVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((!bVar11) && (Debug::minSeverity < 3)) {
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f0,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++"
               ,"");
    fileLine(&local_220,&local_f0,0x177);
    pbVar6 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_220,0,0,"fatal exception: ",0x11);
    local_2a8._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
    paVar8 = &pbVar6->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p == paVar8) {
      local_2a8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
      local_2a8.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
      local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
    }
    else {
      local_2a8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    }
    local_2a8._M_string_length = pbVar6->_M_string_length;
    (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
    pbVar6->_M_string_length = 0;
    (pbVar6->field_2)._M_local_buf[0] = '\0';
    pbVar6 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             append(&local_2a8,": overloaded: mockSyscall(-1, ENOMEM): ");
    local_288._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
    paVar8 = &pbVar6->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p == paVar8) {
      local_288.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
      local_288.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
      local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
    }
    else {
      local_288.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    }
    local_288._M_string_length = pbVar6->_M_string_length;
    (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
    pbVar6->_M_string_length = 0;
    (pbVar6->field_2)._M_local_buf[0] = '\0';
    pcVar7 = strerror(0xc);
    pbVar6 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             append(&local_288,pcVar7);
    local_268._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
    paVar8 = &pbVar6->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p == paVar8) {
      local_268.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
      local_268.field_2._8_8_ = *(size_type *)((long)&pbVar6->field_2 + 8);
      local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
    }
    else {
      local_268.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    }
    local_268._M_string_length = pbVar6->_M_string_length;
    (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
    pbVar6->_M_string_length = 0;
    (pbVar6->field_2)._M_local_buf[0] = '\0';
    pbVar6 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             append(&local_268,"; i = 123; bar; str = foo\n");
    local_240._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
    paVar8 = &pbVar6->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p == paVar8) {
      local_240.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
      local_240.field_2._8_8_ = *(size_type *)((long)&pbVar6->field_2 + 8);
      local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
    }
    else {
      local_240.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    }
    local_240._M_string_length = pbVar6->_M_string_length;
    (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
    pbVar6->_M_string_length = 0;
    (pbVar6->field_2)._M_local_buf[0] = '\0';
    Debug::
    log<char_const(&)[262],kj::_::DebugComparison<std::__cxx11::string,std::__cxx11::string&>&,std::__cxx11::string,std::__cxx11::string&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++"
               ,0x17c,ERROR,
               "\"failed: expected \" \"(( \\\"fatal exception: \\\" + fileLine(\\\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++\\\", line) + \\\": overloaded: mockSyscall(-1, ENOMEM): \\\" + strerror(12) + \\\"; i = 123; bar; str = foo\\\\n\\\" )) == (text)\", _kjCondition, ( \"fatal exception: \" + fileLine(\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++\", line) + \": overloaded: mockSyscall(-1, ENOMEM): \" + strerror(12) + \"; i = 123; bar; str = foo\\n\" ), text"
               ,(char (*) [262])
                "failed: expected (( \"fatal exception: \" + fileLine(\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++\", line) + \": overloaded: mockSyscall(-1, ENOMEM): \" + strerror(12) + \"; i = 123; bar; str = foo\\n\" )) == (text)"
               ,(DebugComparison<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                 *)&mockCallback,&local_240,&text);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != &local_288.field_2) {
      operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
      operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((string *)mockCallback.super_ExceptionCallback._vptr_ExceptionCallback != psVar1) {
    operator_delete(mockCallback.super_ExceptionCallback._vptr_ExceptionCallback,
                    (ulong)(mockCallback.text._M_dataplus._M_p + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)text._M_dataplus._M_p != &text.field_2) {
    operator_delete(text._M_dataplus._M_p,
                    CONCAT71(text.field_2._M_allocated_capacity._1_7_,text.field_2._M_local_buf[0])
                    + 1);
  }
  text._M_dataplus._M_p = (pointer)&text.field_2;
  text._M_string_length = 0;
  text.field_2._M_local_buf[0] = '\0';
  ExceptionCallback::ExceptionCallback(&mockCallback.super_ExceptionCallback);
  psVar1 = &mockCallback.text;
  mockCallback.super_ExceptionCallback._vptr_ExceptionCallback =
       (_func_int **)&PTR__MockExceptionCallback_002256d0;
  mockCallback.text._M_dataplus._M_p = (pointer)&mockCallback.text.field_2;
  mockCallback.text._M_string_length = 0;
  mockCallback.text.field_2._M_allocated_capacity =
       mockCallback.text.field_2._M_allocated_capacity & 0xffffffffffffff00;
  mockCallback.outputPipe = -1;
  do {
    *piVar5 = 0x26;
    iVar3 = Debug::getOsErrorNumber(false);
  } while (iVar3 == -1);
  if (iVar3 != 0) {
    Debug::Fault::Fault<int,int&,char_const(&)[4],char_const*&>
              ((Fault *)&local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++"
               ,0x17f,iVar3,"mockSyscall(-1, ENOSYS)","i, \"bar\", str",&i,(char (*) [4])0x1cedd5,
               &str);
    Debug::Fault::fatal((Fault *)&local_240);
  }
  if (Debug::minSeverity < 3) {
    Debug::log<char_const(&)[19]>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++"
               ,0x17f,ERROR,"\"expected exception\"",(char (*) [19])"expected exception");
  }
  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&text,psVar1);
  MockExceptionCallback::~MockExceptionCallback(&mockCallback);
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_110,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++"
             ,"");
  fileLine(&local_198,&local_110,0x17f);
  pbVar6 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           replace(&local_198,0,0,"fatal exception: ",0x11);
  local_220._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
  paVar8 = &pbVar6->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p == paVar8) {
    local_220.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_220.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
    local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
  }
  else {
    local_220.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
  }
  local_220._M_string_length = pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
  pbVar6->_M_string_length = 0;
  (pbVar6->field_2)._M_local_buf[0] = '\0';
  pbVar6 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_220,": unimplemented: mockSyscall(-1, ENOSYS): ");
  local_2a8._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
  paVar8 = &pbVar6->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p == paVar8) {
    local_2a8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_2a8.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
    local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
  }
  else {
    local_2a8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
  }
  local_2a8._M_string_length = pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
  pbVar6->_M_string_length = 0;
  (pbVar6->field_2)._M_local_buf[0] = '\0';
  pcVar7 = strerror(0x26);
  pbVar6 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_2a8,pcVar7);
  local_288._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
  paVar8 = &pbVar6->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p == paVar8) {
    local_288.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_288.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
    local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
  }
  else {
    local_288.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
  }
  local_288._M_string_length = pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
  pbVar6->_M_string_length = 0;
  (pbVar6->field_2)._M_local_buf[0] = '\0';
  pbVar6 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_288,"; i = 123; bar; str = foo\n");
  paVar8 = &local_268.field_2;
  local_268._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
  paVar9 = &pbVar6->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p == paVar9) {
    local_268.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_268.field_2._8_8_ = *(size_type *)((long)&pbVar6->field_2 + 8);
    local_268._M_dataplus._M_p = (pointer)paVar8;
  }
  else {
    local_268.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
  }
  pEVar2 = (ExceptionCallback *)pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar9;
  pbVar6->_M_string_length = 0;
  (pbVar6->field_2)._M_local_buf[0] = '\0';
  paVar9 = &local_240.field_2;
  _Var10._M_p = local_268._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p == paVar8) {
    local_240.field_2._8_8_ = local_268.field_2._8_8_;
    _Var10._M_p = (pointer)paVar9;
  }
  local_240.field_2._M_allocated_capacity = local_268.field_2._M_allocated_capacity;
  local_268._M_string_length = 0;
  local_268.field_2._M_allocated_capacity =
       local_268.field_2._M_allocated_capacity & 0xffffffffffffff00;
  if (pEVar2 == (ExceptionCallback *)text._M_string_length) {
    bVar11 = true;
    local_268._M_dataplus._M_p = (pointer)paVar8;
    if (pEVar2 != (ExceptionCallback *)0x0) {
      local_240._M_dataplus._M_p = _Var10._M_p;
      local_240._M_string_length = (size_type)pEVar2;
      iVar3 = bcmp(_Var10._M_p,text._M_dataplus._M_p,(size_t)pEVar2);
      bVar11 = iVar3 == 0;
    }
  }
  else {
    bVar11 = false;
    local_268._M_dataplus._M_p = (pointer)paVar8;
  }
  mockCallback.super_ExceptionCallback._vptr_ExceptionCallback = (_func_int **)_Var10._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var10._M_p == paVar9) {
    mockCallback.text._M_string_length = local_240.field_2._8_8_;
    mockCallback.super_ExceptionCallback._vptr_ExceptionCallback = (_func_int **)psVar1;
  }
  mockCallback.text._M_dataplus._M_p = (pointer)local_240.field_2._M_allocated_capacity;
  local_240._M_string_length = 0;
  local_240.field_2._M_allocated_capacity =
       local_240.field_2._M_allocated_capacity & 0xffffffffffffff00;
  mockCallback.text.field_2._M_allocated_capacity = (size_type)&text;
  mockCallback.text.field_2._8_8_ = anon_var_dwarf_19d17;
  mockCallback.outputPipe = 5;
  mockCallback._52_4_ = 0;
  local_240._M_dataplus._M_p = (pointer)paVar9;
  mockCallback.super_ExceptionCallback.next = pEVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if ((!bVar11) && (Debug::minSeverity < 3)) {
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_130,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++"
               ,"");
    fileLine(&local_220,&local_130,0x17f);
    pbVar6 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_220,0,0,"fatal exception: ",0x11);
    local_2a8._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
    paVar8 = &pbVar6->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p == paVar8) {
      local_2a8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
      local_2a8.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
      local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
    }
    else {
      local_2a8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    }
    local_2a8._M_string_length = pbVar6->_M_string_length;
    (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
    pbVar6->_M_string_length = 0;
    (pbVar6->field_2)._M_local_buf[0] = '\0';
    pbVar6 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             append(&local_2a8,": unimplemented: mockSyscall(-1, ENOSYS): ");
    local_288._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
    paVar8 = &pbVar6->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p == paVar8) {
      local_288.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
      local_288.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
      local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
    }
    else {
      local_288.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    }
    local_288._M_string_length = pbVar6->_M_string_length;
    (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
    pbVar6->_M_string_length = 0;
    (pbVar6->field_2)._M_local_buf[0] = '\0';
    pcVar7 = strerror(0x26);
    pbVar6 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             append(&local_288,pcVar7);
    local_268._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
    paVar8 = &pbVar6->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p == paVar8) {
      local_268.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
      local_268.field_2._8_8_ = *(size_type *)((long)&pbVar6->field_2 + 8);
      local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
    }
    else {
      local_268.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    }
    local_268._M_string_length = pbVar6->_M_string_length;
    (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
    pbVar6->_M_string_length = 0;
    (pbVar6->field_2)._M_local_buf[0] = '\0';
    pbVar6 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             append(&local_268,"; i = 123; bar; str = foo\n");
    local_240._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
    paVar8 = &pbVar6->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p == paVar8) {
      local_240.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
      local_240.field_2._8_8_ = *(size_type *)((long)&pbVar6->field_2 + 8);
      local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
    }
    else {
      local_240.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    }
    local_240._M_string_length = pbVar6->_M_string_length;
    (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
    pbVar6->_M_string_length = 0;
    (pbVar6->field_2)._M_local_buf[0] = '\0';
    Debug::
    log<char_const(&)[265],kj::_::DebugComparison<std::__cxx11::string,std::__cxx11::string&>&,std::__cxx11::string,std::__cxx11::string&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++"
               ,0x184,ERROR,
               "\"failed: expected \" \"(( \\\"fatal exception: \\\" + fileLine(\\\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++\\\", line) + \\\": unimplemented: mockSyscall(-1, ENOSYS): \\\" + strerror(38) + \\\"; i = 123; bar; str = foo\\\\n\\\" )) == (text)\", _kjCondition, ( \"fatal exception: \" + fileLine(\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++\", line) + \": unimplemented: mockSyscall(-1, ENOSYS): \" + strerror(38) + \"; i = 123; bar; str = foo\\n\" ), text"
               ,(char (*) [265])
                "failed: expected (( \"fatal exception: \" + fileLine(\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++\", line) + \": unimplemented: mockSyscall(-1, ENOSYS): \" + strerror(38) + \"; i = 123; bar; str = foo\\n\" )) == (text)"
               ,(DebugComparison<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                 *)&mockCallback,&local_240,&text);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != &local_288.field_2) {
      operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
      operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
  }
  if ((string *)mockCallback.super_ExceptionCallback._vptr_ExceptionCallback != psVar1) {
    operator_delete(mockCallback.super_ExceptionCallback._vptr_ExceptionCallback,
                    (ulong)(mockCallback.text._M_dataplus._M_p + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)text._M_dataplus._M_p != &text.field_2) {
    operator_delete(text._M_dataplus._M_p,
                    CONCAT71(text.field_2._M_allocated_capacity._1_7_,text.field_2._M_local_buf[0])
                    + 1);
  }
  recovered = false;
  text._M_dataplus._M_p = (pointer)&text.field_2;
  text._M_string_length = 0;
  text.field_2._M_local_buf[0] = '\0';
  ExceptionCallback::ExceptionCallback(&mockCallback.super_ExceptionCallback);
  mockCallback.super_ExceptionCallback._vptr_ExceptionCallback =
       (_func_int **)&PTR__MockExceptionCallback_002256d0;
  mockCallback.text._M_dataplus._M_p = (pointer)&mockCallback.text.field_2;
  mockCallback.text._M_string_length = 0;
  mockCallback.text.field_2._M_allocated_capacity =
       mockCallback.text.field_2._M_allocated_capacity & 0xffffffffffffff00;
  mockCallback.outputPipe = -1;
  do {
    *piVar5 = 9;
    iVar3 = Debug::getOsErrorNumber(false);
  } while (iVar3 == -1);
  if (iVar3 != 0) {
    Debug::Fault::Fault<int,int&,char_const(&)[4],char_const*&>
              ((Fault *)&local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++"
               ,0x189,iVar3,"result = mockSyscall(-2, EBADF)","i, \"bar\", str",&i,
               (char (*) [4])0x1cedd5,&str);
    recovered = true;
    Debug::Fault::~Fault((Fault *)&local_240);
  }
  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&text,&mockCallback.text);
  MockExceptionCallback::~MockExceptionCallback(&mockCallback);
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_150,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++"
             ,"");
  fileLine(&local_198,&local_150,0x189);
  pbVar6 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           replace(&local_198,0,0,"recoverable exception: ",0x17);
  local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
  paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar6->_M_dataplus)._M_p;
  paVar9 = &pbVar6->field_2;
  if (paVar8 == paVar9) {
    local_220.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_220.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
  }
  else {
    local_220.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_220._M_dataplus._M_p = (pointer)paVar8;
  }
  local_220._M_string_length = pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar9;
  pbVar6->_M_string_length = 0;
  (pbVar6->field_2)._M_local_buf[0] = '\0';
  pbVar6 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_220,": failed: mockSyscall(-2, EBADF): ");
  local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
  paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar6->_M_dataplus)._M_p;
  paVar9 = &pbVar6->field_2;
  if (paVar8 == paVar9) {
    local_2a8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_2a8.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
  }
  else {
    local_2a8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_2a8._M_dataplus._M_p = (pointer)paVar8;
  }
  local_2a8._M_string_length = pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar9;
  pbVar6->_M_string_length = 0;
  (pbVar6->field_2)._M_local_buf[0] = '\0';
  pcVar7 = strerror(9);
  pbVar6 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_2a8,pcVar7);
  local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
  paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar6->_M_dataplus)._M_p;
  paVar9 = &pbVar6->field_2;
  if (paVar8 == paVar9) {
    local_288.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_288.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
  }
  else {
    local_288.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_288._M_dataplus._M_p = (pointer)paVar8;
  }
  local_288._M_string_length = pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar9;
  pbVar6->_M_string_length = 0;
  (pbVar6->field_2)._M_local_buf[0] = '\0';
  pbVar6 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_288,"; i = 123; bar; str = foo\n");
  paVar8 = &local_268.field_2;
  local_268._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
  paVar9 = &pbVar6->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p == paVar9) {
    local_268.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_268.field_2._8_8_ = *(size_type *)((long)&pbVar6->field_2 + 8);
    local_268._M_dataplus._M_p = (pointer)paVar8;
  }
  else {
    local_268.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
  }
  pEVar2 = (ExceptionCallback *)pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar9;
  pbVar6->_M_string_length = 0;
  (pbVar6->field_2)._M_local_buf[0] = '\0';
  paVar9 = &local_240.field_2;
  _Var10._M_p = local_268._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p == paVar8) {
    local_240.field_2._8_8_ = local_268.field_2._8_8_;
    _Var10._M_p = (pointer)paVar9;
  }
  local_240.field_2._M_allocated_capacity = local_268.field_2._M_allocated_capacity;
  local_268._M_string_length = 0;
  local_268.field_2._M_allocated_capacity =
       local_268.field_2._M_allocated_capacity & 0xffffffffffffff00;
  if (pEVar2 == (ExceptionCallback *)text._M_string_length) {
    if (pEVar2 == (ExceptionCallback *)0x0) {
      bVar11 = true;
      local_268._M_dataplus._M_p = (pointer)paVar8;
    }
    else {
      local_268._M_dataplus._M_p = (pointer)paVar8;
      local_240._M_dataplus._M_p = _Var10._M_p;
      local_240._M_string_length = (size_type)pEVar2;
      iVar4 = bcmp(_Var10._M_p,text._M_dataplus._M_p,(size_t)pEVar2);
      bVar11 = iVar4 == 0;
    }
  }
  else {
    bVar11 = false;
    local_268._M_dataplus._M_p = (pointer)paVar8;
  }
  mockCallback.super_ExceptionCallback._vptr_ExceptionCallback = (_func_int **)_Var10._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var10._M_p == paVar9) {
    mockCallback.text._M_string_length = local_240.field_2._8_8_;
    mockCallback.super_ExceptionCallback._vptr_ExceptionCallback = (_func_int **)&mockCallback.text;
  }
  mockCallback.text._M_dataplus._M_p = (pointer)local_240.field_2._M_allocated_capacity;
  local_240._M_string_length = 0;
  local_240.field_2._M_allocated_capacity =
       local_240.field_2._M_allocated_capacity & 0xffffffffffffff00;
  mockCallback.text.field_2._8_8_ = anon_var_dwarf_19d17;
  mockCallback.outputPipe = 5;
  mockCallback._52_4_ = 0;
  local_240._M_dataplus._M_p = (pointer)paVar9;
  mockCallback.super_ExceptionCallback.next = pEVar2;
  mockCallback.text.field_2._M_allocated_capacity = (size_type)&text;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  if ((!bVar11) && (Debug::minSeverity < 3)) {
    local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_170,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++"
               ,"");
    fileLine(&local_220,&local_170,0x189);
    pbVar6 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_220,0,0,"recoverable exception: ",0x17);
    local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
    paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(pbVar6->_M_dataplus)._M_p;
    paVar9 = &pbVar6->field_2;
    if (paVar8 == paVar9) {
      local_2a8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
      local_2a8.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
    }
    else {
      local_2a8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
      local_2a8._M_dataplus._M_p = (pointer)paVar8;
    }
    local_2a8._M_string_length = pbVar6->_M_string_length;
    (pbVar6->_M_dataplus)._M_p = (pointer)paVar9;
    pbVar6->_M_string_length = 0;
    (pbVar6->field_2)._M_local_buf[0] = '\0';
    pbVar6 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             append(&local_2a8,": failed: mockSyscall(-2, EBADF): ");
    local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
    paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(pbVar6->_M_dataplus)._M_p;
    paVar9 = &pbVar6->field_2;
    if (paVar8 == paVar9) {
      local_288.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
      local_288.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
    }
    else {
      local_288.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
      local_288._M_dataplus._M_p = (pointer)paVar8;
    }
    local_288._M_string_length = pbVar6->_M_string_length;
    (pbVar6->_M_dataplus)._M_p = (pointer)paVar9;
    pbVar6->_M_string_length = 0;
    (pbVar6->field_2)._M_local_buf[0] = '\0';
    pcVar7 = strerror(9);
    pbVar6 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             append(&local_288,pcVar7);
    local_268._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
    paVar8 = &pbVar6->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p == paVar8) {
      local_268.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
      local_268.field_2._8_8_ = *(size_type *)((long)&pbVar6->field_2 + 8);
      local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
    }
    else {
      local_268.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    }
    local_268._M_string_length = pbVar6->_M_string_length;
    (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
    pbVar6->_M_string_length = 0;
    (pbVar6->field_2)._M_local_buf[0] = '\0';
    pbVar6 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             append(&local_268,"; i = 123; bar; str = foo\n");
    local_240._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
    paVar8 = &pbVar6->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p == paVar8) {
      local_240.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
      local_240.field_2._8_8_ = *(size_type *)((long)&pbVar6->field_2 + 8);
      local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
    }
    else {
      local_240.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    }
    local_240._M_string_length = pbVar6->_M_string_length;
    (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
    pbVar6->_M_string_length = 0;
    (pbVar6->field_2)._M_local_buf[0] = '\0';
    Debug::
    log<char_const(&)[262],kj::_::DebugComparison<std::__cxx11::string,std::__cxx11::string&>&,std::__cxx11::string,std::__cxx11::string&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++"
               ,0x18e,ERROR,
               "\"failed: expected \" \"(( \\\"recoverable exception: \\\" + fileLine(\\\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++\\\", line) + \\\": failed: mockSyscall(-2, EBADF): \\\" + strerror(9) + \\\"; i = 123; bar; str = foo\\\\n\\\" )) == (text)\", _kjCondition, ( \"recoverable exception: \" + fileLine(\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++\", line) + \": failed: mockSyscall(-2, EBADF): \" + strerror(9) + \"; i = 123; bar; str = foo\\n\" ), text"
               ,(char (*) [262])
                "failed: expected (( \"recoverable exception: \" + fileLine(\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++\", line) + \": failed: mockSyscall(-2, EBADF): \" + strerror(9) + \"; i = 123; bar; str = foo\\n\" )) == (text)"
               ,(DebugComparison<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                 *)&mockCallback,&local_240,&text);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != &local_288.field_2) {
      operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
      operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
    }
  }
  if ((string *)mockCallback.super_ExceptionCallback._vptr_ExceptionCallback != &mockCallback.text)
  {
    operator_delete(mockCallback.super_ExceptionCallback._vptr_ExceptionCallback,
                    (ulong)(mockCallback.text._M_dataplus._M_p + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)text._M_dataplus._M_p != &text.field_2) {
    operator_delete(text._M_dataplus._M_p,
                    CONCAT71(text.field_2._M_allocated_capacity._1_7_,text.field_2._M_local_buf[0])
                    + 1);
  }
  mockCallback.super_ExceptionCallback._vptr_ExceptionCallback = (_func_int **)&recovered;
  if (iVar3 == 0 && Debug::minSeverity < 3) {
    Debug::log<char_const(&)[27],kj::_::DebugExpression<bool&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++"
               ,400,ERROR,"\"failed: expected \" \"recovered\", _kjCondition",
               (char (*) [27])"failed: expected recovered",(DebugExpression<bool_&> *)&mockCallback)
    ;
  }
  return;
}

Assistant:

TEST(Debug, Syscall) {
  int line;

  int i = 123;
  const char* str = "foo";

  EXPECT_LOG_EQ([&](){
    KJ_SYSCALL(mockSyscall(0));
    KJ_SYSCALL(mockSyscall(1));
  }, "");

  EXPECT_LOG_EQ([&](){
    EXPECT_FATAL(KJ_SYSCALL(mockSyscall(-1, EBADF), i, "bar", str)); line = __LINE__;
  }, (
    "fatal exception: " + fileLine(__FILE__, line) +
        ": failed: mockSyscall(-1, EBADF): " + strerror(EBADF) +
        "; i = 123; bar; str = foo\n"
  ));

  EXPECT_LOG_EQ([&](){
    EXPECT_FATAL(KJ_SYSCALL(mockSyscall(-1, ECONNRESET), i, "bar", str)); line = __LINE__;
  }, (
    "fatal exception: " + fileLine(__FILE__, line) +
        ": disconnected: mockSyscall(-1, ECONNRESET): " + strerror(ECONNRESET) +
        "; i = 123; bar; str = foo\n"
  ));

  EXPECT_LOG_EQ([&](){
    EXPECT_FATAL(KJ_SYSCALL(mockSyscall(-1, ENOMEM), i, "bar", str)); line = __LINE__;
  }, (
    "fatal exception: " + fileLine(__FILE__, line) +
        ": overloaded: mockSyscall(-1, ENOMEM): " + strerror(ENOMEM) +
        "; i = 123; bar; str = foo\n"
  ));

  EXPECT_LOG_EQ([&](){
    EXPECT_FATAL(KJ_SYSCALL(mockSyscall(-1, ENOSYS), i, "bar", str)); line = __LINE__;
  }, (
    "fatal exception: " + fileLine(__FILE__, line) +
        ": unimplemented: mockSyscall(-1, ENOSYS): " + strerror(ENOSYS) +
        "; i = 123; bar; str = foo\n"
  ));

  int result = 0;
  bool recovered = false;
  EXPECT_LOG_EQ([&](){
    KJ_SYSCALL(result = mockSyscall(-2, EBADF), i, "bar", str) { recovered = true; break; } line = __LINE__;
  }, (
    "recoverable exception: " + fileLine(__FILE__, line) +
        ": failed: mockSyscall(-2, EBADF): " + strerror(EBADF) +
        "; i = 123; bar; str = foo\n"
  ));
  EXPECT_EQ(-2, result);
  EXPECT_TRUE(recovered);
}